

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::get_argument_address_space_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRVariable *argument)

{
  bool bVar1;
  SPIRType *type;
  allocator local_21;
  
  type = Compiler::get<spirv_cross::SPIRType>
                   ((Compiler *)this,*(uint32_t *)&(argument->super_IVariant).field_0xc);
  bVar1 = Compiler::is_physical_pointer((Compiler *)this,type);
  if (bVar1) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
  }
  else {
    get_type_address_space_abi_cxx11_
              (__return_storage_ptr__,this,type,(argument->super_IVariant).self.id,true);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::get_argument_address_space(const SPIRVariable &argument)
{
	const auto &type = get<SPIRType>(argument.basetype);
	// BDA is always passed around by value. There is no storage class for the argument itself.
	if (is_physical_pointer(type))
		return "";
	return get_type_address_space(type, argument.self, true);
}